

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

bool __thiscall
helics::ValueFederateManager::getUpdateFromCore(ValueFederateManager *this,Input *inp)

{
  void *pvVar1;
  element_type *peVar2;
  bool bVar3;
  MultiInputHandlingMethod MVar4;
  shared_ptr<const_helics::SmallBuffer> *dt;
  Input *in_RSI;
  shared_ptr<const_helics::SmallBuffer> *in_RDI;
  Input *unaff_retaddr;
  shared_ptr<const_helics::SmallBuffer> *data;
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  *dataV;
  InputData *iData;
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  *in_stack_000002d8;
  Input *in_stack_000002e0;
  shared_ptr<const_helics::SmallBuffer> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffff;
  
  pvVar1 = in_RSI->dataReference;
  MVar4 = Input::getMultiInputMode(in_RSI);
  if (MVar4 == NO_OP) {
    peVar2 = in_RDI[0x20].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    dt = (shared_ptr<const_helics::SmallBuffer> *)
         (**(code **)(*(long *)(peVar2->buffer)._M_elems + 400))
                   (peVar2,(in_RSI->super_Interface).handle.hid,0);
    std::shared_ptr<const_helics::SmallBuffer>::shared_ptr(in_stack_ffffffffffffffb0,in_RDI);
    data_view::operator=
              ((data_view *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),dt);
    std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
              ((shared_ptr<const_helics::SmallBuffer> *)0x29a87c);
    *(undefined1 *)((long)pvVar1 + 0xe0) = 1;
    bVar3 = Input::checkUpdate(unaff_retaddr,(bool)in_stack_ffffffffffffffff);
  }
  else {
    peVar2 = in_RDI[0x20].super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (**(code **)(*(long *)(peVar2->buffer)._M_elems + 0x198))
              (peVar2,(in_RSI->super_Interface).handle.hid);
    *(undefined1 *)((long)pvVar1 + 0xe0) = 0;
    bVar3 = Input::vectorDataProcess(in_stack_000002e0,in_stack_000002d8);
  }
  return bVar3;
}

Assistant:

bool ValueFederateManager::getUpdateFromCore(Input& inp)
{
    auto* iData = static_cast<InputData*>(inp.dataReference);
    if (inp.getMultiInputMode() != MultiInputHandlingMethod::NO_OP) {
        const auto& dataV = coreObject->getAllValues(inp.handle);
        iData->hasUpdate = false;
        return inp.vectorDataProcess(dataV);
    }
    const auto& data = coreObject->getValue(inp.handle);
    iData->lastData = data;
    iData->hasUpdate = true;
    return inp.checkUpdate(true);
}